

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

int update_extend_mc_border_params
              (scale_factors *sf,buf_2d *pre_buf,MV32 scaled_mv,PadBlock *block,int subpel_x_mv,
              int subpel_y_mv,int do_warp,int is_intrabc,int *x_pad,int *y_pad)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int frame_height;
  int frame_width;
  int is_scaled;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_c;
  int iStack_8;
  
  iVar3 = av1_is_scaled((scale_factors *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  uVar1 = *(uint *)(in_RSI + 0x10);
  uVar2 = *(uint *)(in_RSI + 0x14);
  if (((frame_width == 0) && (in_stack_00000008 == 0)) &&
     (((iVar3 != 0 ||
       (((iStack_8 = (int)((ulong)in_RDX >> 0x20), iStack_8 != 0 ||
         (local_c = (int)in_RDX, local_c != 0)) || ((uVar1 & 7) != 0)))) || ((uVar2 & 7) != 0)))) {
    if ((in_R8D != 0) || (*(int *)(in_RDI + 8) != 0x10)) {
      *in_RCX = *in_RCX + -3;
      in_RCX[1] = in_RCX[1] + 4;
      *(undefined4 *)CONCAT44(subpel_x_mv,subpel_y_mv) = 1;
    }
    if ((in_R9D != 0) || (*(int *)(in_RDI + 0xc) != 0x10)) {
      in_RCX[2] = in_RCX[2] + -3;
      in_RCX[3] = in_RCX[3] + 4;
      block->x0 = 1;
    }
    if ((((*in_RCX < 0) || ((int)(uVar1 - 1) < in_RCX[1])) || (in_RCX[2] < 0)) ||
       ((int)(uVar2 - 1) < in_RCX[3])) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static inline int update_extend_mc_border_params(
    const struct scale_factors *const sf, struct buf_2d *const pre_buf,
    MV32 scaled_mv, PadBlock *block, int subpel_x_mv, int subpel_y_mv,
    int do_warp, int is_intrabc, int *x_pad, int *y_pad) {
  const int is_scaled = av1_is_scaled(sf);
  // Get reference width and height.
  int frame_width = pre_buf->width;
  int frame_height = pre_buf->height;

  // Do border extension if there is motion or
  // width/height is not a multiple of 8 pixels.
  if ((!is_intrabc) && (!do_warp) &&
      (is_scaled || scaled_mv.col || scaled_mv.row || (frame_width & 0x7) ||
       (frame_height & 0x7))) {
    if (subpel_x_mv || (sf->x_step_q4 != SUBPEL_SHIFTS)) {
      block->x0 -= AOM_INTERP_EXTEND - 1;
      block->x1 += AOM_INTERP_EXTEND;
      *x_pad = 1;
    }

    if (subpel_y_mv || (sf->y_step_q4 != SUBPEL_SHIFTS)) {
      block->y0 -= AOM_INTERP_EXTEND - 1;
      block->y1 += AOM_INTERP_EXTEND;
      *y_pad = 1;
    }

    // Skip border extension if block is inside the frame.
    if (block->x0 < 0 || block->x1 > frame_width - 1 || block->y0 < 0 ||
        block->y1 > frame_height - 1) {
      return 1;
    }
  }
  return 0;
}